

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::SharedCtor(UninterpretedOption *this,Arena *arena)

{
  Arena *arena_local;
  UninterpretedOption *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x38),0,0x18);
  return;
}

Assistant:

inline void UninterpretedOption::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, positive_int_value_),
           0,
           offsetof(Impl_, double_value_) -
               offsetof(Impl_, positive_int_value_) +
               sizeof(Impl_::double_value_));
}